

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::FoldClamp3
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<const_spvtools::opt::analysis::Constant_*> __l;
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  FeatureManager *this;
  const_reference ppCVar4;
  Constant *pCVar5;
  allocator<const_spvtools::opt::analysis::Constant_*> local_99;
  Constant *local_98;
  Constant *local_90;
  iterator local_88;
  size_type local_80;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_78;
  BinaryScalarFoldingRule local_60;
  Constant *temp;
  Constant *max_val;
  Constant *x;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  
  x = (Constant *)constants;
  constants_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)context;
  OVar1 = Instruction::opcode(inst);
  if (OVar1 != OpExtInst) {
    __assert_fail("inst->opcode() == spv::Op::OpExtInst && \"Expecting an extended instruction.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x622,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp3(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar2 = Instruction::GetSingleWordInOperand((Instruction *)constants_local,0);
  this = IRContext::get_feature_mgr((IRContext *)inst_local);
  uVar3 = FeatureManager::GetExtInstImportId_GLSLstd450(this);
  if (uVar2 != uVar3) {
    __assert_fail("inst->GetSingleWordInOperand(0) == context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() && \"Expecting a GLSLstd450 extended instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x625,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp3(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  ppCVar4 = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                          *)x,1);
  max_val = *ppCVar4;
  ppCVar4 = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                          *)x,3);
  temp = *ppCVar4;
  if ((max_val == (Constant *)0x0) || (temp == (value_type)0x0)) {
    context_local = (IRContext *)0x0;
  }
  else {
    std::
    function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
    ::
    function<spvtools::opt::analysis::Constant_const*(&)(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*),void>
              ((function<spvtools::opt::analysis::Constant_const*(spvtools::opt::analysis::Type_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::Constant_const*,spvtools::opt::analysis::ConstantManager*)>
                *)&local_60,FoldMin);
    uVar2 = Instruction::type_id((Instruction *)constants_local);
    local_98 = max_val;
    local_90 = temp;
    local_88 = &local_98;
    local_80 = 2;
    std::allocator<const_spvtools::opt::analysis::Constant_*>::allocator(&local_99);
    __l._M_len = local_80;
    __l._M_array = local_88;
    std::
    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ::vector(&local_78,__l,&local_99);
    pCVar5 = FoldFPBinaryOp(&local_60,uVar2,&local_78,(IRContext *)inst_local);
    std::
    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ::~vector(&local_78);
    std::allocator<const_spvtools::opt::analysis::Constant_*>::~allocator(&local_99);
    std::
    function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
    ::~function(&local_60);
    if (pCVar5 == temp) {
      context_local = (IRContext *)temp;
    }
    else {
      context_local = (IRContext *)0x0;
    }
  }
  return (Constant *)context_local;
}

Assistant:

const analysis::Constant* FoldClamp3(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpExtInst &&
         "Expecting an extended instruction.");
  assert(inst->GetSingleWordInOperand(0) ==
             context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
         "Expecting a GLSLstd450 extended instruction.");

  const analysis::Constant* x = constants[1];
  const analysis::Constant* max_val = constants[3];

  if (x == nullptr || max_val == nullptr) {
    return nullptr;
  }

  const analysis::Constant* temp =
      FoldFPBinaryOp(FoldMin, inst->type_id(), {x, max_val}, context);
  if (temp == max_val) {
    // We can assume that |min_val| is less than |max_val|.  Therefore, if the
    // result of the max operation is |min_val|, we know the result of the min
    // operation, even if |max_val| is not a constant.
    return max_val;
  }
  return nullptr;
}